

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_csv_parser.hpp
# Opt level: O1

void __thiscall
csv::internals::ThreadSafeDeque<csv::CSVRow>::push_back
          (ThreadSafeDeque<csv::CSVRow> *this,CSVRow *item)

{
  mutex *__mutex;
  _Map_pointer ppCVar1;
  int iVar2;
  undefined8 uVar3;
  
  __mutex = &this->_lock;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    std::deque<csv::CSVRow,_std::allocator<csv::CSVRow>_>::emplace_back<csv::CSVRow>
              (&this->data,item);
    ppCVar1 = (this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if (this->_notify_size <=
        ((long)(this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_start._M_last -
         (long)(this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur >> 3) * -0x3333333333333333 +
        ((long)(this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur -
         (long)(this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
               super__Deque_impl_data._M_finish._M_first >> 3) * -0x3333333333333333 +
        (((long)ppCVar1 -
          (long)(this->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_>._M_impl.
                super__Deque_impl_data._M_start._M_node >> 3) + -1 +
        (ulong)(ppCVar1 == (_Map_pointer)0x0)) * 0xc) {
      std::condition_variable::notify_all();
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void push_back(T&& item) {
                std::lock_guard<std::mutex> lock{ this->_lock };
                this->data.push_back(std::move(item));

                if (this->size() >= _notify_size) {
                    this->_cond.notify_all();
                }
            }